

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  Option *in_stack_00000258;
  int in_stack_00000260;
  int in_stack_00000264;
  Mat *in_stack_00000268;
  Mat *in_stack_00000270;
  
  conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse
            (in_stack_00000270,in_stack_00000268,in_stack_00000264,in_stack_00000260,
             in_stack_00000258);
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}